

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdFinalizeFundRawTx
              (void *handle,void *fund_handle,char *tx_hex,double effective_fee_rate,int64_t *tx_fee
              ,uint32_t *append_txout_count,char **output_tx_hex)

{
  _Base_ptr *pp_Var1;
  uint64_t *puVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  long lVar5;
  _func_int *p_Var6;
  _func_int *p_Var7;
  _func_int *p_Var8;
  bool bVar9;
  char *pcVar10;
  int64_t iVar11;
  CfdException *pCVar12;
  int64_t *piVar13;
  allocator local_202;
  ElementsTransactionApi api;
  UtxoFilter filter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  string local_1b0;
  int64_t *local_190;
  CoinSelectionOption option_params;
  ConfidentialAssetId fee_asset;
  Amount calc_fee;
  Amount tx_fee_value;
  ConfidentialTransactionController ctxc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Amount utxo_fee_value;
  
  local_190 = tx_fee;
  cfd::Initialize();
  puVar2 = &option_params.effective_fee_baserate_;
  option_params._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&option_params,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)&option_params);
  if ((uint64_t *)option_params._0_8_ != puVar2) {
    operator_delete((void *)option_params._0_8_,option_params.effective_fee_baserate_ + 1);
  }
  bVar9 = cfd::capi::IsEmptyString(tx_hex);
  if (!bVar9) {
    if (output_tx_hex == (char **)0x0) {
      option_params._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
           + 0x67;
      option_params.change_spend_size_ = 0xcc7;
      option_params.effective_fee_baserate_ = (uint64_t)anon_var_dwarf_d7687a;
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&option_params,kCfdLogLevelWarning,"output_tx_hex is null.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      option_params._0_8_ = puVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&option_params,"Failed to parameter. output_tx_hex is null.","");
      cfd::core::CfdException::CfdException
                (pCVar12,kCfdIllegalArgumentError,(string *)&option_params);
      __cxa_throw(pCVar12,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
    cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,effective_fee_rate);
    cfd::CoinSelectionOption::SetLongTermFeeBaserate
              (&option_params,*(double *)((long)fund_handle + 0x78));
    cfd::CoinSelectionOption::SetDustFeeRate(&option_params,*(double *)((long)fund_handle + 0x70));
    cfd::CoinSelectionOption::SetKnapsackMinimumChange
              (&option_params,*(int64_t *)((long)fund_handle + 0x80));
    cfd::CoinSelectionOption::SetBlindInfo
              (&option_params,*(int *)((long)fund_handle + 0x88),*(int *)((long)fund_handle + 0x8c))
    ;
    cfd::core::Amount::Amount(&utxo_fee_value);
    cfd::core::Amount::Amount(&tx_fee_value);
    cfd::core::Amount::Amount(&calc_fee);
    if (*(char *)((long)fund_handle + 0x35) == '\x01') {
      cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option_params);
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
           (_func_int **)0x0;
      ctxc.super_AbstractTransactionController.tx_address_ = (AbstractTransaction *)0x0;
      ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x0;
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
           (_func_int **)operator_new(0x21);
      ctxc.super_AbstractTransactionController.tx_address_ =
           (AbstractTransaction *)
           ((long)ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController +
           0x21);
      *(undefined1 *)
       (ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController + 4) =
           *(undefined1 *)((long)fund_handle + 0x34);
      p_Var6 = *(_func_int **)((long)fund_handle + 0x14);
      p_Var7 = *(_func_int **)((long)fund_handle + 0x1c);
      p_Var8 = *(_func_int **)((long)fund_handle + 0x2c);
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController[2] =
           *(_func_int **)((long)fund_handle + 0x24);
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController[3] = p_Var8;
      *ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController = p_Var6;
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController[1] = p_Var7;
      ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)ctxc.super_AbstractTransactionController.tx_address_;
      cfd::core::ByteData::ByteData
                ((ByteData *)&map_target_value,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctxc);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,(ByteData *)&map_target_value);
      if (map_target_value._M_t._M_impl._0_8_ != 0) {
        operator_delete((void *)map_target_value._M_t._M_impl._0_8_,
                        (long)map_target_value._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent - map_target_value._M_t._M_impl._0_8_);
      }
      if (ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController !=
          (_func_int **)0x0) {
        operator_delete(ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController
                        ,(long)ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction
                         - (long)ctxc.super_AbstractTransactionController.
                                 _vptr_AbstractTransactionController);
      }
      cfd::CoinSelectionOption::SetFeeAsset(&option_params,&fee_asset);
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      piVar3 = (int64_t *)**(long **)((long)fund_handle + 0x58);
      piVar4 = (int64_t *)(*(long **)((long)fund_handle + 0x58))[1];
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (piVar3 != piVar4) {
        piVar3 = piVar3 + 4;
        do {
          cfd::core::Amount::Amount((Amount *)&ctxc,*piVar3);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,cfd::core::Amount>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
                      *)&map_target_value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (piVar3 + -4),(Amount *)&ctxc);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&reserve_txout_address,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (piVar3 + -4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (piVar3 + 1));
          piVar13 = piVar3 + 5;
          piVar3 = piVar3 + 9;
        } while (piVar13 != piVar4);
      }
      std::__cxx11::string::string((string *)&local_1b0,tx_hex,&local_202);
      cfd::api::ElementsTransactionApi::FundRawTransaction
                (&ctxc,&api,&local_1b0,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fund_handle + 0x38),&map_target_value,
                 *(vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                   **)((long)fund_handle + 0x48),&reserve_txout_address,&fee_asset,
                 *(bool *)((long)fund_handle + 0x68),effective_fee_rate,&tx_fee_value,&filter,
                 &option_params,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)((long)fund_handle + 0x50),*(NetType_conflict *)((long)fund_handle + 0x10),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,&calc_fee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                (&local_1b0,&ctxc.super_AbstractTransactionController);
      pcVar10 = cfd::capi::CreateString(&local_1b0);
      *output_tx_hex = pcVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
           (_func_int **)&PTR__ConfidentialTransactionController_0087c940;
      cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&ctxc.transaction_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&reserve_txout_address._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
      ::~_Rb_tree(&map_target_value._M_t);
      fee_asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
      if (fee_asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(fee_asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)fee_asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)fee_asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
      lVar5 = **(long **)((long)fund_handle + 0x58);
      if ((*(long **)((long)fund_handle + 0x58))[1] == lVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      cfd::core::Amount::Amount((Amount *)&reserve_txout_address,*(int64_t *)(lVar5 + 0x20));
      std::__cxx11::string::string((string *)&map_target_value,tx_hex,(allocator *)&local_1b0);
      cfd::api::TransactionApi::FundRawTransaction
                ((TransactionController *)&ctxc,(TransactionApi *)&fee_asset,
                 (string *)&map_target_value,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fund_handle + 0x38),(Amount *)&reserve_txout_address,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fund_handle + 0x40),(string *)(lVar5 + 0x28),effective_fee_rate,
                 &tx_fee_value,&filter,&option_params,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)((long)fund_handle + 0x50),*(NetType_conflict *)((long)fund_handle + 0x10),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,&calc_fee);
      pp_Var1 = &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)map_target_value._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)map_target_value._M_t._M_impl._0_8_,
                        (ulong)((long)&(map_target_value._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                ((string *)&map_target_value,&ctxc.super_AbstractTransactionController);
      pcVar10 = cfd::capi::CreateString((string *)&map_target_value);
      *output_tx_hex = pcVar10;
      if ((_Base_ptr *)map_target_value._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)map_target_value._M_t._M_impl._0_8_,
                        (ulong)((long)&(map_target_value._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
           (_func_int **)&PTR__TransactionController_0087e158;
      cfd::core::Transaction::~Transaction((Transaction *)&ctxc.transaction_);
    }
    iVar11 = cfd::core::Amount::GetSatoshiValue(&calc_fee);
    *(int64_t *)((long)fund_handle + 0x60) = iVar11;
    if (local_190 != (int64_t *)0x0) {
      iVar11 = cfd::core::Amount::GetSatoshiValue(&tx_fee_value);
      *local_190 = iVar11;
    }
    if (append_txout_count != (uint32_t *)0x0) {
      *append_txout_count =
           (uint32_t)
           ((ulong)((*(long **)((long)fund_handle + 0x50))[1] -
                   **(long **)((long)fund_handle + 0x50)) >> 5);
    }
    option_params.fee_asset_._vptr_ConfidentialAssetId =
         (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
    if (option_params.fee_asset_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(option_params.fee_asset_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)option_params.fee_asset_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)option_params.fee_asset_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  option_params._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
       + 0x67;
  option_params.change_spend_size_ = 0xcc1;
  option_params.effective_fee_baserate_ = (uint64_t)anon_var_dwarf_d7687a;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&option_params,kCfdLogLevelWarning,"tx_hex is null or empty.");
  pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
  option_params._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&option_params,"Failed to parameter. tx_hex is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&option_params);
  __cxa_throw(pCVar12,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeFundRawTx(
    void* handle, void* fund_handle, const char* tx_hex,
    double effective_fee_rate, int64_t* tx_fee, uint32_t* append_txout_count,
    char** output_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
#ifndef CFD_DISABLE_ELEMENTS
  auto convert_to_asset = [](const uint8_t* asset) -> ConfidentialAssetId {
    std::vector<uint8_t> bytes(33);
    memcpy(bytes.data(), asset, bytes.size());
    return ConfidentialAssetId(ByteData(bytes));
  };
#endif  // CFD_DISABLE_ELEMENTS

  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }
    if (output_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "output_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output_tx_hex is null.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    CoinSelectionOption option_params;
    option_params.SetEffectiveFeeBaserate(effective_fee_rate);
    option_params.SetLongTermFeeBaserate(buffer->long_term_fee_rate);
    option_params.SetDustFeeRate(buffer->dust_fee_rate);
    option_params.SetKnapsackMinimumChange(buffer->knapsack_min_change);
#ifndef CFD_DISABLE_ELEMENTS
    option_params.SetBlindInfo(buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS

    Amount utxo_fee_value;
    UtxoFilter filter;
    Amount tx_fee_value;
    Amount calc_fee;
    std::vector<Utxo> utxo_list;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      // elements
      option_params.InitializeConfidentialTxSizeInfo();
      ConfidentialAssetId fee_asset = convert_to_asset(buffer->fee_asset);
      option_params.SetFeeAsset(fee_asset);

      std::map<std::string, Amount> map_target_value;
      std::map<std::string, std::string> reserve_txout_address;
      for (const auto& target : *(buffer->targets)) {
        map_target_value.emplace(target.asset, Amount(target.amount));
        reserve_txout_address.emplace(target.asset, target.reserved_address);
      }

      ElementsTransactionApi api;
      ConfidentialTransactionController ctxc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, map_target_value,
          *buffer->input_elements_utxos, reserve_txout_address, fee_asset,
          buffer->is_blind, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(ctxc.GetHex());
      }
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      // bitcoin
      option_params.InitializeTxSizeInfo();
      auto& target = buffer->targets->at(0);
      Amount target_value(target.amount);

      TransactionApi api;
      TransactionController txc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, target_value, *buffer->input_utxos,
          target.reserved_address, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(txc.GetHex());
      }
    }

    buffer->calculate_fee = calc_fee.GetSatoshiValue();
    if (tx_fee != nullptr) {
      *tx_fee = tx_fee_value.GetSatoshiValue();
    }
    if (append_txout_count != nullptr) {
      *append_txout_count =
          static_cast<uint32_t>(buffer->append_txout_addresses->size());
    }

    result = CfdErrorCode::kCfdSuccess;
    return result;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}